

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_iface_common.h
# Opt level: O2

void yuvconfig2image(aom_image_t *img,YV12_BUFFER_CONFIG *yv12,void *user_priv)

{
  uint uVar1;
  int iVar2;
  aom_transfer_characteristics_t aVar3;
  aom_color_range_t aVar4;
  int iVar5;
  aom_img_fmt_t aVar6;
  uint uVar7;
  
  uVar1 = yv12->subsampling_y;
  if (uVar1 == 0) {
    uVar7 = yv12->subsampling_x;
    if (uVar7 == 0) {
      img->fmt = AOM_IMG_FMT_I444;
      iVar5 = 0x18;
      uVar7 = 0;
      aVar6 = AOM_IMG_FMT_I44416;
    }
    else {
      img->fmt = AOM_IMG_FMT_I422;
      iVar5 = 0x10;
      aVar6 = AOM_IMG_FMT_I42216;
    }
  }
  else {
    img->fmt = AOM_IMG_FMT_I420;
    uVar7 = yv12->subsampling_x;
    iVar5 = 0xc;
    aVar6 = AOM_IMG_FMT_I42016;
  }
  aVar3 = yv12->transfer_characteristics;
  img->cp = yv12->color_primaries;
  img->tc = aVar3;
  img->mc = yv12->matrix_coefficients;
  img->monochrome = (uint)yv12->monochrome;
  aVar4 = yv12->color_range;
  img->csp = yv12->chroma_sample_position;
  img->range = aVar4;
  img->bit_depth = 8;
  img->w = (yv12->field_0).field_0.y_width;
  img->h = (yv12->field_1).field_0.y_height;
  img->d_w = (yv12->field_2).field_0.y_crop_width;
  img->d_h = (yv12->field_3).field_0.y_crop_height;
  iVar2 = yv12->render_height;
  img->r_w = yv12->render_width;
  img->r_h = iVar2;
  img->x_chroma_shift = uVar7;
  img->y_chroma_shift = uVar1;
  img->planes[0] = (yv12->field_5).field_0.y_buffer;
  img->planes[1] = (yv12->field_5).field_0.u_buffer;
  img->planes[2] = (yv12->field_5).field_0.v_buffer;
  img->stride[0] = (yv12->field_4).field_0.y_stride;
  iVar2 = (yv12->field_4).field_0.uv_stride;
  img->stride[1] = iVar2;
  img->stride[2] = iVar2;
  if ((yv12->flags & 8) != 0) {
    iVar5 = iVar5 * 2;
    img->fmt = aVar6;
    img->bit_depth = yv12->bit_depth;
    img->planes[0] = (uchar *)((long)(yv12->field_5).field_0.y_buffer * 2);
    img->planes[1] = (uchar *)((long)(yv12->field_5).field_0.u_buffer * 2);
    img->planes[2] = (uchar *)((long)(yv12->field_5).field_0.v_buffer * 2);
    img->stride[0] = (yv12->field_4).field_0.y_stride * 2;
    img->stride[1] = (yv12->field_4).field_0.uv_stride * 2;
    img->stride[2] = (yv12->field_4).field_0.uv_stride * 2;
  }
  img->bps = iVar5;
  img->user_priv = (void *)0x0;
  img->img_data = yv12->buffer_alloc;
  img->img_data_owner = 0;
  img->self_allocd = 0;
  img->sz = yv12->frame_size;
  img->metadata = (aom_metadata_array_t *)0x0;
  return;
}

Assistant:

static inline void yuvconfig2image(aom_image_t *img,
                                   const YV12_BUFFER_CONFIG *yv12,
                                   void *user_priv) {
  /* aom_img_wrap() doesn't allow specifying independent strides for
   * the Y, U, and V planes, nor other alignment adjustments that
   * might be representable by a YV12_BUFFER_CONFIG, so we just
   * initialize all the fields.
   */
  int bps;
  if (!yv12->subsampling_y) {
    if (!yv12->subsampling_x) {
      img->fmt = AOM_IMG_FMT_I444;
      bps = 24;
    } else {
      img->fmt = AOM_IMG_FMT_I422;
      bps = 16;
    }
  } else {
    img->fmt = AOM_IMG_FMT_I420;
    bps = 12;
  }
  img->cp = yv12->color_primaries;
  img->tc = yv12->transfer_characteristics;
  img->mc = yv12->matrix_coefficients;
  img->monochrome = yv12->monochrome;
  img->csp = yv12->chroma_sample_position;
  img->range = yv12->color_range;
  img->bit_depth = 8;
  img->w = yv12->y_width;
  img->h = yv12->y_height;
  img->d_w = yv12->y_crop_width;
  img->d_h = yv12->y_crop_height;
  img->r_w = yv12->render_width;
  img->r_h = yv12->render_height;
  img->x_chroma_shift = yv12->subsampling_x;
  img->y_chroma_shift = yv12->subsampling_y;
  img->planes[AOM_PLANE_Y] = yv12->y_buffer;
  img->planes[AOM_PLANE_U] = yv12->u_buffer;
  img->planes[AOM_PLANE_V] = yv12->v_buffer;
  img->stride[AOM_PLANE_Y] = yv12->y_stride;
  img->stride[AOM_PLANE_U] = yv12->uv_stride;
  img->stride[AOM_PLANE_V] = yv12->uv_stride;
  if (yv12->flags & YV12_FLAG_HIGHBITDEPTH) {
    bps *= 2;
    // aom_image_t uses byte strides and a pointer to the first byte
    // of the image.
    img->fmt = (aom_img_fmt_t)(img->fmt | AOM_IMG_FMT_HIGHBITDEPTH);
    img->bit_depth = yv12->bit_depth;
    img->planes[AOM_PLANE_Y] = (uint8_t *)CONVERT_TO_SHORTPTR(yv12->y_buffer);
    img->planes[AOM_PLANE_U] = (uint8_t *)CONVERT_TO_SHORTPTR(yv12->u_buffer);
    img->planes[AOM_PLANE_V] = (uint8_t *)CONVERT_TO_SHORTPTR(yv12->v_buffer);
    img->stride[AOM_PLANE_Y] = 2 * yv12->y_stride;
    img->stride[AOM_PLANE_U] = 2 * yv12->uv_stride;
    img->stride[AOM_PLANE_V] = 2 * yv12->uv_stride;
  }
  img->bps = bps;
  img->user_priv = user_priv;
  img->img_data = yv12->buffer_alloc;
  img->img_data_owner = 0;
  img->self_allocd = 0;
  img->sz = yv12->frame_size;
  assert(!yv12->metadata);
  img->metadata = NULL;
}